

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O1

bool __thiscall
duckdb::LateMaterialization::OptimizeLargeLimit
          (LateMaterialization *this,LogicalLimit *limit,idx_t limit_val,bool has_offset)

{
  DBConfig *pDVar1;
  reference this_00;
  type pLVar2;
  undefined7 in_register_00000009;
  
  pDVar1 = DBConfig::GetConfig(this->optimizer->context);
  if ((int)CONCAT71(in_register_00000009,has_offset) == 0) {
    if (1000000 < limit_val) {
      return false;
    }
    if ((pDVar1->options).preserve_insertion_order == false) {
      return false;
    }
  }
  else if (1000000 < limit_val) {
    return false;
  }
  pLVar2 = &limit->super_LogicalOperator;
  do {
    this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](&pLVar2->children,0);
    pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator*(this_00);
  } while (pLVar2->type == LOGICAL_PROJECTION);
  return pLVar2->type == LOGICAL_GET;
}

Assistant:

bool LateMaterialization::OptimizeLargeLimit(LogicalLimit &limit, idx_t limit_val, bool has_offset) {
	auto &config = DBConfig::GetConfig(optimizer.context);
	if (!has_offset && !config.options.preserve_insertion_order) {
		// we avoid optimizing large limits if preserve insertion order is false
		// since the limit is executed in parallel anyway
		return false;
	}
	// we only perform this optimization until a certain amount of maximum values to reduce memory constraints
	// since we still materialize the set of row-ids in the hash table this optimization can increase memory pressure
	// FIXME: make this configurable as well
	static constexpr const idx_t LIMIT_MAX_VAL = 1000000;
	if (limit_val > LIMIT_MAX_VAL) {
		return false;
	}
	// we only support large limits if they are directly below the source
	reference<LogicalOperator> current_op = *limit.children[0];
	while (current_op.get().type != LogicalOperatorType::LOGICAL_GET) {
		if (current_op.get().type != LogicalOperatorType::LOGICAL_PROJECTION) {
			return false;
		}
		current_op = *current_op.get().children[0];
	}
	return true;
}